

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_exts.c
# Opt level: O2

LY_ERR lyplg_ext_parse_extension_instance(lysp_ctx *pctx,lysp_ext_instance *ext)

{
  lysp_stmt *plVar1;
  lysp_ext_substmt *plVar2;
  char *pcVar3;
  LY_ERR LVar4;
  lysp_stmt **pplVar5;
  void **ppvVar6;
  void **ppvVar7;
  lysp_ext_substmt *plVar8;
  ly_ctx *ctx;
  char *pcVar9;
  
  pplVar5 = &ext->child;
  do {
    plVar1 = *pplVar5;
    if (plVar1 == (lysp_stmt *)0x0) {
      ppvVar7 = (void **)0x0;
      while( true ) {
        if (ext->substmts == (lysp_ext_substmt *)0x0) {
          ppvVar6 = (void **)0x0;
        }
        else {
          ppvVar6 = ext->substmts[-1].storage_p;
        }
        pplVar5 = &ext->child;
        if (ppvVar6 <= ppvVar7) break;
        while (plVar1 = *pplVar5, plVar1 != (lysp_stmt *)0x0) {
          if ((ext->substmts[(long)ppvVar7].stmt == plVar1->kw) &&
             (LVar4 = lys_parser_ext_instance_stmt(pctx,ext->substmts + (long)ppvVar7,plVar1),
             LVar4 != LY_SUCCESS)) {
            return LVar4;
          }
          pplVar5 = &plVar1->next;
        }
        ppvVar7 = (void **)((long)ppvVar7 + 1);
      }
      return LY_SUCCESS;
    }
    if ((plVar1->flags & 0xc00) == 0) {
      plVar2 = ext->substmts;
      ppvVar7 = (void **)0x0;
      plVar8 = plVar2;
      while( true ) {
        if (plVar2 == (lysp_ext_substmt *)0x0) goto LAB_00193944;
        if ((plVar2[-1].storage_p <= ppvVar7) || (plVar8->stmt == plVar1->kw)) break;
        ppvVar7 = (void **)((long)ppvVar7 + 1);
        plVar8 = plVar8 + 1;
      }
      if (ppvVar7 == plVar2[-1].storage_p) {
LAB_00193944:
        if (pctx == (lysp_ctx *)0x0) {
          ctx = (ly_ctx *)0x0;
        }
        else {
          ctx = (ly_ctx *)
                **(undefined8 **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
        }
        pcVar9 = ext->argument;
        pcVar3 = ", ";
        if (pcVar9 == (char *)0x0) {
          pcVar3 = "\t";
          pcVar9 = "";
        }
        ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid keyword \"%s\" as a child of \"%s%s%s\" extension instance.",plVar1->stmt,
                ext->name,pcVar3 + 1,pcVar9);
        return LY_EVALID;
      }
    }
    pplVar5 = &plVar1->next;
  } while( true );
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_ext_parse_extension_instance(struct lysp_ctx *pctx, struct lysp_ext_instance *ext)
{
    LY_ERR rc = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u;
    struct lysp_stmt *stmt;

    /* check for invalid substatements */
    LY_LIST_FOR(ext->child, stmt) {
        if (stmt->flags & (LYS_YIN_ATTR | LYS_YIN_ARGUMENT)) {
            continue;
        }
        LY_ARRAY_FOR(ext->substmts, u) {
            if (ext->substmts[u].stmt == stmt->kw) {
                break;
            }
        }
        if (u == LY_ARRAY_COUNT(ext->substmts)) {
            LOGVAL(PARSER_CTX(pctx), LYVE_SYNTAX_YANG, "Invalid keyword \"%s\" as a child of \"%s%s%s\" extension instance.",
                    stmt->stmt, ext->name, ext->argument ? " " : "", ext->argument ? ext->argument : "");
            rc = LY_EVALID;
            goto cleanup;
        }
    }

    /* parse all the known statements */
    LY_ARRAY_FOR(ext->substmts, u) {
        LY_LIST_FOR(ext->child, stmt) {
            if (ext->substmts[u].stmt != stmt->kw) {
                continue;
            }

            if ((rc = lys_parser_ext_instance_stmt(pctx, &ext->substmts[u], stmt))) {
                goto cleanup;
            }
        }
    }

cleanup:
    return rc;
}